

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

uint64_t absl::lts_20240722::hash_internal::MixingHashState::CombineContiguousImpl
                   (ulong state,uchar *first,ulong len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint32_t uVar4;
  size_t sVar5;
  uint64_t uVar6;
  type_conflict1 tVar7;
  pair<unsigned_long,_unsigned_long> pVar8;
  uint128 m;
  uint64_t hi;
  uint64_t lo;
  pair<unsigned_long,_unsigned_long> p;
  uint64_t v;
  size_t len_local;
  uchar *first_local;
  uint64_t state_local;
  MultType m_1;
  
  if (len < 0x11) {
    if (8 < len) {
      pVar8 = Read9To16(first,len);
      lo = pVar8.first;
      p.first = pVar8.second;
      tVar7 = rotr<unsigned_long>(lo,0x35);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = state + 0x9ddfea08eb382d69 ^ p.first;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = tVar7 + state + 0x9ddfea08eb382d69;
      return SUB168(auVar1 * auVar3,0) ^ SUB168(auVar1 * auVar3,8);
    }
    if (len < 4) {
      if (len == 0) {
        return state;
      }
      uVar4 = Read1To3(first,len);
      p.second = (unsigned_long)uVar4;
    }
    else {
      p.second = Read4To8(first,len);
    }
  }
  else {
    sVar5 = PiecewiseChunkSize();
    if (sVar5 < len) {
      uVar6 = absl::lts_20240722::hash_internal::MixingHashState::CombineLargeContiguousImpl64
                        (state,first,len);
      return uVar6;
    }
    p.second = absl::lts_20240722::hash_internal::MixingHashState::LowLevelHashImpl(first,len);
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = state + p.second;
  return SUB168(auVar2 * ZEXT816(0x9ddfea08eb382d69),0) ^
         SUB168(auVar2 * ZEXT816(0x9ddfea08eb382d69),8);
}

Assistant:

inline uint64_t MixingHashState::CombineContiguousImpl(
    uint64_t state, const unsigned char* first, size_t len,
    std::integral_constant<int, 8> /* sizeof_size_t */) {
  // For large values we use LowLevelHash or CityHash depending on the platform,
  // for small ones we just use a multiplicative hash.
  uint64_t v;
  if (len > 16) {
    if (ABSL_PREDICT_FALSE(len > PiecewiseChunkSize())) {
      return CombineLargeContiguousImpl64(state, first, len);
    }
    v = Hash64(first, len);
  } else if (len > 8) {
    // This hash function was constructed by the ML-driven algorithm discovery
    // using reinforcement learning. We fed the agent lots of inputs from
    // microbenchmarks, SMHasher, low hamming distance from generated inputs and
    // picked up the one that was good on micro and macrobenchmarks.
    auto p = Read9To16(first, len);
    uint64_t lo = p.first;
    uint64_t hi = p.second;
    // Rotation by 53 was found to be most often useful when discovering these
    // hashing algorithms with ML techniques.
    lo = absl::rotr(lo, 53);
    state += kMul;
    lo += state;
    state ^= hi;
    uint128 m = state;
    m *= lo;
    return static_cast<uint64_t>(m ^ (m >> 64));
  } else if (len >= 4) {
    v = Read4To8(first, len);
  } else if (len > 0) {
    v = Read1To3(first, len);
  } else {
    // Empty ranges have no effect.
    return state;
  }
  return Mix(state, v);
}